

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AgentRunner.h
# Opt level: O2

void __thiscall
aeron::concurrent::AgentRunner<aeron::ClientConductor,_aeron::concurrent::SleepingIdleStrategy>::
AgentRunner(AgentRunner<aeron::ClientConductor,_aeron::concurrent::SleepingIdleStrategy> *this,
           ClientConductor *agent,SleepingIdleStrategy *idleStrategy,
           exception_handler_t *exceptionHandler,string *name)

{
  this->m_agent = agent;
  this->m_idleStrategy = idleStrategy;
  this->m_exceptionHandler = exceptionHandler;
  (this->m_running)._M_base._M_i = true;
  (this->m_thread)._M_id._M_thread = 0;
  std::__cxx11::string::string((string *)&this->m_name,(string *)name);
  return;
}

Assistant:

AgentRunner(
        Agent& agent, IdleStrategy& idleStrategy, logbuffer::exception_handler_t& exceptionHandler, const std::string& name) :
        m_agent(agent),
        m_idleStrategy(idleStrategy),
        m_exceptionHandler(exceptionHandler),
        m_running(true),
        m_name(name)
    {
    }